

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj_table.cc
# Opt level: O0

void __thiscall Table::test(Table *this)

{
  int iVar1;
  Test *pTVar2;
  ostream *poVar3;
  string local_128;
  anon_class_1_0_00000001 local_f1;
  function<void_(int,_const_Test_&)> local_f0;
  int local_d0;
  int local_cc;
  int i_3;
  int i_2;
  const_iterator __end1_1;
  const_iterator __begin1_1;
  initializer_list<int> local_90;
  initializer_list<int> *local_80;
  initializer_list<int> *__range1_1;
  const_iterator piStack_70;
  int i_1;
  const_iterator __end1;
  const_iterator __begin1;
  initializer_list<int> local_30;
  initializer_list<int> *local_20;
  initializer_list<int> *__range1;
  Table *pTStack_10;
  int i;
  Table *this_local;
  
  pTStack_10 = this;
  for (__range1._4_4_ = 0; __range1._4_4_ < 10; __range1._4_4_ = __range1._4_4_ + 1) {
    iVar1 = __range1._4_4_ << 1;
    pTVar2 = ObjTable<Test>::operator[](&this->super_ObjTable<Test>,__range1._4_4_);
    pTVar2->value = iVar1;
    iVar1 = __range1._4_4_ + 1000;
    pTVar2 = ObjTable<Test>::operator[](&this->super_ObjTable<Test>,__range1._4_4_ + 1000);
    pTVar2->value = iVar1 * 2;
  }
  memcpy(&__begin1,&DAT_004100fc,0x30);
  local_30._M_array = (iterator)&__begin1;
  local_30._M_len = 0xc;
  local_20 = &local_30;
  __end1 = std::initializer_list<int>::begin(local_20);
  piStack_70 = std::initializer_list<int>::end(local_20);
  for (; __end1 != piStack_70; __end1 = __end1 + 1) {
    __range1_1._4_4_ = *__end1;
    iVar1 = __range1_1._4_4_ << 1;
    pTVar2 = ObjTable<Test>::operator[](&this->super_ObjTable<Test>,__range1_1._4_4_);
    pTVar2->value = iVar1;
  }
  ObjTable<Test>::resize(&this->super_ObjTable<Test>,100);
  memcpy(&__begin1_1,&DAT_0041012c,0x28);
  local_90._M_array = (iterator)&__begin1_1;
  local_90._M_len = 10;
  local_80 = &local_90;
  __end1_1 = std::initializer_list<int>::begin(local_80);
  _i_3 = std::initializer_list<int>::end(local_80);
  for (; __end1_1 != _i_3; __end1_1 = __end1_1 + 1) {
    local_cc = *__end1_1;
    iVar1 = local_cc * 3;
    pTVar2 = ObjTable<Test>::operator[](&this->super_ObjTable<Test>,local_cc);
    pTVar2->value = iVar1;
  }
  ObjTable<Test>::resize(&this->super_ObjTable<Test>,200);
  for (local_d0 = 1; local_d0 < 10; local_d0 = local_d0 + 1) {
    ObjTable<Test>::emplace_back<int&>(&this->super_ObjTable<Test>,&local_d0);
  }
  std::function<void(int,Test_const&)>::
  function<Table::test()::_lambda(auto:1,auto:2_const&)_1_,void>
            ((function<void(int,Test_const&)> *)&local_f0,&local_f1);
  ObjTable<Test>::forEach(&this->super_ObjTable<Test>,&local_f0);
  std::function<void_(int,_const_Test_&)>::~function(&local_f0);
  poVar3 = std::operator<<((ostream *)&std::cout,"2000 : ");
  pTVar2 = ObjTable<Test>::operator[](&this->super_ObjTable<Test>,2000);
  std::__cxx11::to_string(&local_128,pTVar2->value);
  poVar3 = std::operator<<(poVar3,(string *)&local_128);
  std::operator<<(poVar3,"\n");
  std::__cxx11::string::~string((string *)&local_128);
  return;
}

Assistant:

void
    test()
    {
        for (int i = 0; i < 10; ++i) {
            (*this)[i].value = 2 * i;
            (*this)[1000 + i].value = 2 * (1000 + i);
        }
        for (int i: {50, 60, 70, 98, 99, 100, 101, 150, 198, 199, 200, 201}) {
            (*this)[i].value = 2 * i;
        }
        resize(100);
        for (int i: {1, 99, 100, 105, 110, 120, 205, 206, 207, 210}) {
            (*this)[i].value = 3 * i;
        }
        resize(200);

        for (int i = 1; i < 10; ++i) {
            emplace_back(i);
        }

        forEach([](auto i, auto const& item) -> void {
            if (item.value) {
                std::cout << std::to_string(i) << " : " << std::to_string(item.value) << "\n";
            }
        });

        std::cout << "2000 : " << std::to_string((*this)[2000].value) << "\n";
    }